

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequential_attribute_decoder.h
# Opt level: O1

bool __thiscall
draco::SequentialIntegerAttributeDecoder::TransformAttributeToOriginalFormat
          (SequentialIntegerAttributeDecoder *this,
          vector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
          *point_ids)

{
  PointCloudDecoder *pPVar1;
  _func_int *UNRECOVERED_JUMPTABLE;
  int iVar2;
  undefined8 in_RDX;
  
  pPVar1 = (this->super_SequentialAttributeDecoder).decoder_;
  if ((pPVar1 != (PointCloudDecoder *)0x0) && (pPVar1->version_major_ < 2)) {
    return true;
  }
  UNRECOVERED_JUMPTABLE =
       (this->super_SequentialAttributeDecoder)._vptr_SequentialAttributeDecoder[0xc];
  iVar2 = (*UNRECOVERED_JUMPTABLE)
                    (this,(ulong)((long)(point_ids->
                                        super__Vector_base<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(point_ids->
                                       super__Vector_base<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_start) >> 2 & 0xffffffff
                     ,in_RDX,UNRECOVERED_JUMPTABLE);
  return SUB41(iVar2,0);
}

Assistant:

PointCloudDecoder *decoder() const { return decoder_; }